

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

yyjson_mut_val *
duckdb_yyjson::unsafe_yyjson_mut_ptr_getx
          (yyjson_mut_val *val,char *ptr,size_t ptr_len,yyjson_ptr_ctx *ctx,yyjson_ptr_err *err)

{
  byte *__s2;
  int iVar1;
  yyjson_mut_val *pyVar2;
  char *pcVar3;
  yyjson_ptr_code yVar4;
  ulong uVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong __n;
  byte *pbVar8;
  bool bVar9;
  byte bVar10;
  long lVar11;
  byte *pbVar12;
  byte bVar13;
  yyjson_mut_val *pyVar14;
  ulong uVar15;
  bool bVar16;
  byte *local_60;
  
  pbVar12 = (byte *)(ptr + ptr_len);
  pyVar14 = (yyjson_mut_val *)0x0;
  bVar9 = false;
  pbVar6 = (byte *)ptr;
  do {
    __s2 = pbVar6 + 1;
    for (pbVar8 = __s2; ((pbVar8 < pbVar12 && (*pbVar8 != 0x2f)) && (*pbVar8 != 0x7e));
        pbVar8 = pbVar8 + 1) {
    }
    if ((pbVar8 == pbVar12) || (*pbVar8 != 0x7e)) {
      __n = (long)pbVar8 - (long)__s2;
      bVar16 = true;
    }
    else {
      if (pbVar8 < pbVar12) {
        bVar13 = 0x7e;
        lVar11 = 0;
        local_60 = pbVar8;
        do {
          pbVar8 = local_60 + 1;
          if (bVar13 == 0x7e) {
            if ((pbVar8 == pbVar12) || ((*pbVar8 & 0xfe) != 0x30)) {
              if (err == (yyjson_ptr_err *)0x0) {
                return (yyjson_mut_val *)0x0;
              }
              pcVar3 = "invalid escaped character";
              yVar4 = 2;
              goto LAB_0188b2e5;
            }
            lVar11 = lVar11 + 1;
          }
        } while ((pbVar8 < pbVar12) && (bVar13 = *pbVar8, local_60 = pbVar8, bVar13 != 0x2f));
      }
      else {
        lVar11 = 0;
      }
      __n = (long)pbVar8 - (long)(__s2 + lVar11);
      bVar16 = lVar11 == 0;
    }
    uVar15 = val->tag;
    bVar13 = (byte)uVar15 & 7;
    if (bVar13 == 7) {
      if (0xff < uVar15) {
        uVar15 = uVar15 >> 8;
        pyVar14 = (yyjson_mut_val *)(val->uni).u64;
        do {
          pyVar2 = pyVar14->next->next;
          if (pyVar2->tag >> 8 == __n) {
            if (bVar16) {
              iVar1 = bcmp((pyVar2->uni).ptr,__s2,__n);
              if (iVar1 != 0) goto LAB_0188b07e;
            }
            else if (__n != 0) {
              uVar5 = 0;
              pbVar6 = __s2;
              do {
                if (*pbVar6 == 0x7e) {
                  bVar10 = 0x2f;
                  if (pbVar6[1] == 0x30) {
                    bVar10 = 0x7e;
                  }
                  if (bVar10 != (pyVar2->uni).str[uVar5]) goto LAB_0188b07e;
                  pbVar6 = pbVar6 + 1;
                }
                else if ((pyVar2->uni).str[uVar5] != *pbVar6) goto LAB_0188b07e;
                pbVar6 = pbVar6 + 1;
                uVar5 = uVar5 + 1;
                if (__n == uVar5) break;
              } while( true );
            }
            pyVar2 = pyVar2->next;
            goto LAB_0188b1bf;
          }
LAB_0188b07e:
          uVar15 = uVar15 - 1;
          pyVar14 = pyVar2;
        } while (uVar15 != 0);
        pyVar14 = (yyjson_mut_val *)0x0;
        pyVar2 = (yyjson_mut_val *)0x0;
        goto LAB_0188b1bf;
      }
      if ((ctx == (yyjson_ptr_ctx *)0x0) || (pbVar8 != pbVar12)) goto LAB_0188b2cf;
      pyVar14 = (yyjson_mut_val *)0x0;
      pyVar2 = (yyjson_mut_val *)0x0;
LAB_0188b203:
      ctx->ctn = val;
      ctx->pre = pyVar14;
      bVar16 = true;
    }
    else {
      if (bVar13 == 6) {
        if (uVar15 < 0x100) {
          if ((__n == 1) && ((*__s2 == 0x30 || (*__s2 == 0x2d)))) {
LAB_0188b14d:
            bVar9 = true;
LAB_0188b154:
            pyVar14 = (yyjson_mut_val *)0x0;
            goto LAB_0188b157;
          }
        }
        else if (0xffffffffffffffec < __n - 0x14) {
          if (*__s2 == 0x2d) {
            if (__n < 2) goto LAB_0188b14d;
          }
          else {
            pyVar14 = (yyjson_mut_val *)(val->uni).u64;
            if (*__s2 == 0x30) {
              if (__n < 2) {
                bVar9 = false;
LAB_0188b1bb:
                pyVar2 = pyVar14->next;
                goto LAB_0188b1bf;
              }
            }
            else {
              uVar5 = 0;
              pbVar7 = __s2;
              do {
                if (9 < (ulong)*pbVar7 - 0x30) goto LAB_0188b2be;
                uVar5 = ((ulong)*pbVar7 - 0x30) + uVar5 * 10;
                pbVar7 = pbVar7 + 1;
              } while (pbVar7 < pbVar6 + __n + 1);
              if (uVar5 != 0) {
                bVar9 = uVar5 == 0xffffffffffffffff || uVar5 == uVar15 >> 8;
                if (uVar15 >> 8 <= uVar5) goto LAB_0188b154;
                do {
                  pyVar14 = pyVar14->next;
                  uVar5 = uVar5 - 1;
                } while (uVar5 != 0);
                goto LAB_0188b1bb;
              }
            }
          }
        }
LAB_0188b2be:
        pyVar14 = (yyjson_mut_val *)0x0;
        bVar9 = false;
      }
LAB_0188b157:
      pyVar2 = (yyjson_mut_val *)0x0;
LAB_0188b1bf:
      bVar16 = pbVar8 == pbVar12;
      if (ctx != (yyjson_ptr_ctx *)0x0 && bVar16) {
        if (bVar13 != 7) {
          bVar16 = true;
          if (bVar13 != 6) goto LAB_0188b20d;
          if (pyVar2 == (yyjson_mut_val *)0x0 && !bVar9) goto LAB_0188b2cf;
          bVar9 = (bool)(pyVar2 == (yyjson_mut_val *)0x0 | bVar9);
        }
        goto LAB_0188b203;
      }
    }
LAB_0188b20d:
    if (pyVar2 == (yyjson_mut_val *)0x0) {
LAB_0188b2cf:
      if (err != (yyjson_ptr_err *)0x0) {
        pcVar3 = "JSON pointer cannot be resolved";
        yVar4 = 3;
        local_60 = __s2;
LAB_0188b2e5:
        err->code = yVar4;
        err->msg = pcVar3;
        err->pos = (long)local_60 - (long)ptr;
      }
      return (yyjson_mut_val *)0x0;
    }
    pbVar6 = pbVar8;
    val = pyVar2;
    if (bVar16) {
      return pyVar2;
    }
  } while( true );
}

Assistant:

yyjson_mut_val *unsafe_yyjson_mut_ptr_getx(yyjson_mut_val *val,
                                           const char *ptr,
                                           size_t ptr_len,
                                           yyjson_ptr_ctx *ctx,
                                           yyjson_ptr_err *err) {

    const char *hdr = ptr, *end = ptr + ptr_len, *token;
    usize len, esc;
    yyjson_mut_val *ctn, *pre = NULL;
    yyjson_type type;
    bool idx_is_last = false;

    while (true) {
        token = ptr_next_token(&ptr, end, &len, &esc);
        if (unlikely(!token)) return_err_syntax(NULL, ptr - hdr);
        ctn = val;
        type = unsafe_yyjson_get_type(val);
        if (type == YYJSON_TYPE_OBJ) {
            val = ptr_mut_obj_get(val, token, len, esc, &pre);
        } else if (type == YYJSON_TYPE_ARR) {
            val = ptr_mut_arr_get(val, token, len, esc, &pre, &idx_is_last);
        } else {
            val = NULL;
        }
        if (ctx && (ptr == end)) {
            if (type == YYJSON_TYPE_OBJ ||
                (type == YYJSON_TYPE_ARR && (val || idx_is_last))) {
                ctx->ctn = ctn;
                ctx->pre = pre;
            }
        }
        if (!val) return_err_resolve(NULL, token - hdr);
        if (ptr == end) return val;
    }
}